

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeQuaternionEKF.cpp
# Opt level: O0

bool __thiscall
iDynTree::AttitudeQuaternionEKF::ekfComputeJacobianH
          (AttitudeQuaternionEKF *this,VectorDynSize *x,MatrixDynSize *H)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  long lVar5;
  double *pdVar6;
  ulong in_RDX;
  long in_RDI;
  double dVar7;
  double dVar8;
  double dVar9;
  double factor;
  double multiple;
  double denominator;
  double q0q3plusq1q2Squared;
  double common_factorSquared;
  double common_factor;
  double q3squared;
  double q2squared;
  double q1q2;
  double q0q3;
  MatrixDynSize dhacc_by_dq;
  UnitQuaternion q;
  DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffbd8;
  Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_4,_false>
  *in_stack_fffffffffffffbe0;
  Index in_stack_fffffffffffffbe8;
  Index in_stack_fffffffffffffbf0;
  DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffbf8;
  MatrixDynSize *in_stack_fffffffffffffc08;
  DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffc10;
  MatrixDynSize local_d0 [144];
  VectorFixSize<4U> local_40;
  ulong local_20;
  byte local_1;
  
  local_20 = in_RDX;
  lVar5 = iDynTree::VectorDynSize::size();
  if (lVar5 != *(long *)(in_RDI + 0x3d8)) {
    iDynTree::reportError("AttitudeQuaternionEKF","computejacobianH","state size mismatch");
    local_1 = 0;
    goto LAB_00623b44;
  }
  lVar5 = iDynTree::MatrixDynSize::rows();
  if (lVar5 == *(long *)(in_RDI + 0x3e0)) {
    lVar5 = iDynTree::MatrixDynSize::cols();
    if (lVar5 == *(long *)(in_RDI + 0x3d8)) {
      iDynTree::MatrixDynSize::zero();
      VectorFixSize<4U>::VectorFixSize(&local_40);
      toEigen((VectorDynSize *)in_stack_fffffffffffffbf8);
      Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::
      block<4,1>((DenseBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                  *)in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
      toEigen<4U>((VectorFixSize<4U> *)in_stack_fffffffffffffbf8);
      Eigen::Map<Eigen::Matrix<double,4,1,0,4,1>,0,Eigen::Stride<0,0>>::operator=
                ((Map<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_> *)
                 in_stack_fffffffffffffbe0,
                 (DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_4,_1,_false>_>
                  *)in_stack_fffffffffffffbd8);
      iDynTree::MatrixDynSize::MatrixDynSize(local_d0);
      iDynTree::MatrixDynSize::resize((ulong)local_d0,3);
      pdVar6 = VectorFixSize<4U>::operator()(&local_40,2);
      dVar9 = *pdVar6;
      pdVar6 = (double *)iDynTree::MatrixDynSize::operator()((ulong)local_d0,2);
      *pdVar6 = dVar9;
      pdVar6 = (double *)iDynTree::MatrixDynSize::operator()((ulong)local_d0,0);
      *pdVar6 = dVar9;
      pdVar6 = VectorFixSize<4U>::operator()(&local_40,3);
      dVar9 = *pdVar6;
      pdVar6 = (double *)iDynTree::MatrixDynSize::operator()((ulong)local_d0,1);
      *pdVar6 = -dVar9;
      pdVar6 = (double *)iDynTree::MatrixDynSize::operator()((ulong)local_d0,0);
      *pdVar6 = -dVar9;
      pdVar6 = VectorFixSize<4U>::operator()(&local_40,1);
      dVar9 = *pdVar6;
      pdVar6 = (double *)iDynTree::MatrixDynSize::operator()((ulong)local_d0,1);
      *pdVar6 = -dVar9;
      pdVar6 = (double *)iDynTree::MatrixDynSize::operator()((ulong)local_d0,0);
      *pdVar6 = -dVar9;
      pdVar6 = VectorFixSize<4U>::operator()(&local_40,0);
      dVar9 = *pdVar6;
      pdVar6 = (double *)iDynTree::MatrixDynSize::operator()((ulong)local_d0,2);
      *pdVar6 = -dVar9;
      pdVar6 = (double *)iDynTree::MatrixDynSize::operator()((ulong)local_d0,1);
      *pdVar6 = -dVar9;
      pdVar6 = VectorFixSize<4U>::operator()(&local_40,0);
      dVar9 = *pdVar6;
      pdVar6 = (double *)iDynTree::MatrixDynSize::operator()((ulong)local_d0,0);
      *pdVar6 = dVar9;
      pdVar6 = VectorFixSize<4U>::operator()(&local_40,2);
      dVar9 = *pdVar6;
      pdVar6 = (double *)iDynTree::MatrixDynSize::operator()((ulong)local_d0,1);
      *pdVar6 = -dVar9;
      pdVar6 = VectorFixSize<4U>::operator()(&local_40,1);
      dVar9 = *pdVar6;
      pdVar6 = (double *)iDynTree::MatrixDynSize::operator()((ulong)local_d0,2);
      *pdVar6 = dVar9;
      pdVar6 = VectorFixSize<4U>::operator()(&local_40,3);
      dVar9 = *pdVar6;
      pdVar6 = (double *)iDynTree::MatrixDynSize::operator()((ulong)local_d0,2);
      *pdVar6 = -dVar9;
      pdVar6 = VectorFixSize<3U>::operator()((VectorFixSize<3U> *)(in_RDI + 0x4c0),2);
      if ((*pdVar6 != -1.0) || (NAN(*pdVar6))) {
        pdVar6 = VectorFixSize<3U>::operator()((VectorFixSize<3U> *)(in_RDI + 0x4c0),2);
        if ((*pdVar6 == 1.0) && (!NAN(*pdVar6))) {
          toEigen(in_stack_fffffffffffffc08);
          Eigen::
          DenseBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>
          ::operator*=(in_stack_fffffffffffffc10,(Scalar *)in_stack_fffffffffffffc08);
          goto LAB_006235d4;
        }
        iDynTree::reportError
                  ("AttitudeQuaternionEKF","computejacobianH",
                   "filter assumes gravity pointing upward or downward only");
        local_1 = 0;
      }
      else {
        toEigen(in_stack_fffffffffffffc08);
        Eigen::
        DenseBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>::
        operator*=(in_stack_fffffffffffffc10,(Scalar *)in_stack_fffffffffffffc08);
LAB_006235d4:
        toEigen(in_stack_fffffffffffffc08);
        toEigen(in_stack_fffffffffffffc08);
        Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>>::
        block<3,4>(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
        Eigen::Block<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>,3,4,false>
        ::operator=(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
        if (*(long *)(in_RDI + 0x3e0) == 4) {
          pdVar6 = VectorFixSize<4U>::operator()(&local_40,0);
          dVar9 = *pdVar6;
          pdVar6 = VectorFixSize<4U>::operator()(&local_40,3);
          dVar1 = *pdVar6;
          pdVar6 = VectorFixSize<4U>::operator()(&local_40,1);
          dVar2 = *pdVar6;
          pdVar6 = VectorFixSize<4U>::operator()(&local_40,2);
          dVar3 = *pdVar6;
          pdVar6 = VectorFixSize<4U>::operator()(&local_40,2);
          dVar7 = *pdVar6;
          pdVar6 = VectorFixSize<4U>::operator()(&local_40,2);
          dVar8 = *pdVar6;
          pdVar6 = VectorFixSize<4U>::operator()(&local_40,3);
          dVar4 = *pdVar6;
          pdVar6 = VectorFixSize<4U>::operator()(&local_40,3);
          dVar7 = dVar7 * dVar8 + dVar4 * *pdVar6;
          dVar7 = 1.0 - (dVar7 + dVar7);
          dVar8 = dVar9 * dVar1 + dVar2 * dVar3;
          dVar8 = dVar8 * dVar8 * 4.0 + dVar7 * dVar7;
          dVar7 = (dVar7 + dVar7) / dVar8;
          dVar8 = ((dVar9 * dVar1 + dVar2 * dVar3) * -8.0) / dVar8;
          pdVar6 = VectorFixSize<4U>::operator()(&local_40,3);
          dVar9 = *pdVar6;
          pdVar6 = (double *)iDynTree::MatrixDynSize::operator()(local_20,3);
          *pdVar6 = dVar9 * dVar7;
          pdVar6 = VectorFixSize<4U>::operator()(&local_40,2);
          dVar9 = *pdVar6;
          pdVar6 = (double *)iDynTree::MatrixDynSize::operator()(local_20,3);
          *pdVar6 = dVar9 * dVar7;
          pdVar6 = VectorFixSize<4U>::operator()(&local_40,1);
          dVar9 = *pdVar6;
          pdVar6 = VectorFixSize<4U>::operator()(&local_40,2);
          dVar9 = dVar9 * dVar7 - *pdVar6 * dVar8;
          pdVar6 = (double *)iDynTree::MatrixDynSize::operator()(local_20,3);
          *pdVar6 = dVar9;
          pdVar6 = VectorFixSize<4U>::operator()(&local_40,0);
          dVar9 = *pdVar6;
          pdVar6 = VectorFixSize<4U>::operator()(&local_40,3);
          dVar9 = dVar9 * dVar7 - *pdVar6 * dVar8;
          pdVar6 = (double *)iDynTree::MatrixDynSize::operator()(local_20,3);
          *pdVar6 = dVar9;
        }
        local_1 = 1;
      }
      iDynTree::MatrixDynSize::~MatrixDynSize(local_d0);
      goto LAB_00623b44;
    }
  }
  iDynTree::reportError("AttitudeQuaternionEKF","computejacobianH","jacobian matrix size mismatch");
  local_1 = 0;
LAB_00623b44:
  return (bool)(local_1 & 1);
}

Assistant:

bool iDynTree::AttitudeQuaternionEKF::ekfComputeJacobianH(iDynTree::VectorDynSize& x, iDynTree::MatrixDynSize& H)
{
    using iDynTree::toEigen;

    if (x.size() != m_state_size)
    {
        reportError("AttitudeQuaternionEKF", "computejacobianH", "state size mismatch");
        return false;
    }

    if (H.rows() != m_output_size || H.cols() != m_state_size)
    {
        reportError("AttitudeQuaternionEKF", "computejacobianH", "jacobian matrix size mismatch");
        return false;
    }

    H.zero();
    iDynTree::UnitQuaternion q;
    toEigen(q) = toEigen(x).block<4,1>(0, 0);

    iDynTree::MatrixDynSize dhacc_by_dq;
    dhacc_by_dq.resize(3, 4);
    dhacc_by_dq(0, 0) = dhacc_by_dq(2, 2) = q(2);
    dhacc_by_dq(0, 1) = dhacc_by_dq(1, 2) = -q(3);
    dhacc_by_dq(0, 3) = dhacc_by_dq(1, 0) = -q(1);
    dhacc_by_dq(1, 1) = dhacc_by_dq(2, 0) = -q(0);
    dhacc_by_dq(0, 2) = q(0);
    dhacc_by_dq(1, 3) = -q(2);
    dhacc_by_dq(2, 1) = q(1);
    dhacc_by_dq(2, 3) = -q(3);

    if (m_gravity_direction(2) == -1)
    {
        toEigen(dhacc_by_dq) *= 2;
    }
    else if (m_gravity_direction(2) == 1)
    {
        toEigen(dhacc_by_dq) *= -2;
    }
    else
    {
        reportError("AttitudeQuaternionEKF", "computejacobianH", "filter assumes gravity pointing upward or downward only");
        return false;
    }

    toEigen(H).block<3, 4>(0, 0) = toEigen(dhacc_by_dq);

    if (m_output_size == output_dimensions_with_magnetometer)
    {
        double q0q3{q(0)*q(3)};
        double q1q2{q(1)*q(2)};
        double q2squared{q(2)*q(2)};
        double q3squared{q(3)*q(3)};
        double common_factor{(1 - 2*(q2squared + q3squared))};
        double common_factorSquared{common_factor*common_factor};
        double q0q3plusq1q2Squared{((q0q3+q1q2)*(q0q3+q1q2))};
        double denominator{(4*q0q3plusq1q2Squared) + (common_factorSquared)};

        double multiple{(2*common_factor/denominator)};
        double factor{(-8*(q0q3 + q1q2))/denominator};

        H(3, 0) = q(3)*multiple;
        H(3, 1) = q(2)*multiple;
        H(3, 1) = (q(1)*multiple) - (q(2)*factor);
        H(3, 2) = (q(0)*multiple) - (q(3)*factor);
    }

    return true;
}